

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O0

_Bool borg_flow_dark_interesting(int y,int x,int b_stair)

{
  _Bool _Var1;
  borg_grid *local_30;
  borg_grid *ag;
  int local_20;
  int i;
  int ox;
  int oy;
  int b_stair_local;
  int x_local;
  int y_local;
  
  local_30 = borg_grids[y] + x;
  if (local_30->feat == '\0') {
    x_local._3_1_ = true;
  }
  else if ((local_30->feat < 0xf) && (local_30->feat != '\x02')) {
    x_local._3_1_ = false;
  }
  else if ((local_30->feat == '\x13') || (local_30->feat == '\x14')) {
    if (borg.trait[0x72] == 0) {
      if (borg.trait[0x2d] < 100000) {
        if (borg.trait[0x1a] == 0) {
          x_local._3_1_ = false;
        }
        else {
          _Var1 = borg_can_dig(false,local_30->feat);
          if (_Var1) {
            x_local._3_1_ = true;
          }
          else {
            x_local._3_1_ = false;
          }
        }
      }
      else {
        x_local._3_1_ = false;
      }
    }
    else {
      x_local._3_1_ = false;
    }
  }
  else {
    if (((local_30->feat == '\x15') || (local_30->feat == '\x11')) || (local_30->feat == '\x12')) {
      if (borg.trait[0x72] != 0) {
        return false;
      }
      if (!vault_on_level) {
        return false;
      }
      _Var1 = borg_can_dig(false,local_30->feat);
      if (!_Var1) {
        return false;
      }
      if (((x < 0xc5) && (y < 0x41)) && ((1 < x && (1 < y)))) {
        for (local_20 = -1; local_20 < 2; local_20 = local_20 + 1) {
          for (i = -1; i < 2; i = i + 1) {
            if (borg_grids[i + y][local_20 + x].feat == '\x16') {
              return true;
            }
          }
        }
      }
      local_30 = borg_grids[y] + x;
    }
    if ((local_30->feat == '\x10') && (borg.trait[0x6c] == 0)) {
      x_local._3_1_ = true;
    }
    else if (local_30->feat == '\x02') {
      if ((breeder_level & 1U) != 0) {
        for (ag._4_4_ = 0; ag._4_4_ < track_door.num; ag._4_4_ = ag._4_4_ + 1) {
          if ((track_door.x[ag._4_4_] == x) && (track_door.y[ag._4_4_] == y)) {
            return false;
          }
        }
      }
      x_local._3_1_ = true;
    }
    else {
      _Var1 = feat_is_trap_holding((uint)local_30->feat);
      if (_Var1) {
        if (borg.trait[0x70] == 0) {
          if (borg.trait[0x72] == 0) {
            if (borg.trait[0x78] == 0) {
              if (borg.trait[0x1a] == 0) {
                x_local._3_1_ = false;
              }
              else if (((borg.trait[0x69] == 99) && ((local_30->trap & 1U) != 0)) &&
                      ((local_30->glyph & 1U) == 0)) {
                x_local._3_1_ = false;
              }
              else if (borg.trait[0x1b] < 0x3c) {
                x_local._3_1_ = false;
              }
              else if ((borg.trait[0x36] < 0x1e) && (borg.trait[0x23] < 0x14)) {
                x_local._3_1_ = false;
              }
              else if ((borg.trait[0x36] < 0x2d) && (borg.trait[0x23] < 10)) {
                x_local._3_1_ = false;
              }
              else if ((borg.trait[0x37] < 0x1e) && (borg.trait[0x23] < 0x14)) {
                x_local._3_1_ = false;
              }
              else if ((borg.trait[0x37] < 0x2d) && (borg.trait[0x23] < 10)) {
                x_local._3_1_ = false;
              }
              else if ((scaryguy_on_level & 1U) == 0) {
                x_local._3_1_ = true;
              }
              else {
                x_local._3_1_ = false;
              }
            }
            else {
              x_local._3_1_ = false;
            }
          }
          else {
            x_local._3_1_ = false;
          }
        }
        else {
          x_local._3_1_ = false;
        }
      }
      else {
        x_local._3_1_ = false;
      }
    }
  }
  return x_local._3_1_;
}

Assistant:

static bool borg_flow_dark_interesting(int y, int x, int b_stair)
{
    int oy;
    int ox, i;

    borg_grid *ag;

    /* Get the borg_grid */
    ag = &borg_grids[y][x];

    /* Explore unknown grids */
    if (ag->feat == FEAT_NONE)
        return true;

    /* Efficiency -- Ignore "boring" grids */
    if (ag->feat < FEAT_SECRET && ag->feat != FEAT_CLOSED)
        return false;

    /* Explore "known treasure" */
    if ((ag->feat == FEAT_MAGMA_K) || (ag->feat == FEAT_QUARTZ_K)) {
        /* Do not dig when confused */
        if (borg.trait[BI_ISCONFUSED])
            return false;

        /* Do not bother if super rich */
        if (borg.trait[BI_GOLD] >= 100000)
            return false;

        /* Not when darkened */
        if (borg.trait[BI_LIGHT] == 0)
            return false;

        /* don't try to dig if we can't */
        if (!borg_can_dig(false, ag->feat))
            return false;

        /* Okay */
        return true;
    }

    /* "Vaults" Explore non perma-walls adjacent to a perma wall */
    if (ag->feat == FEAT_GRANITE || ag->feat == FEAT_MAGMA
        || ag->feat == FEAT_QUARTZ) {

        /* Do not attempt when confused */
        if (borg.trait[BI_ISCONFUSED])
            return false;

        /* hack and cheat.  No vaults  on this level */
        if (!vault_on_level)
            return false;

        /* make sure we can dig */
        if (!borg_can_dig(false, ag->feat))
            return false;

        /* Do not attempt on the edge */
        if (x < AUTO_MAX_X - 1 && y < AUTO_MAX_Y - 1 && x > 1 && y > 1) {
            /* scan the adjacent grids */
            for (ox = -1; ox <= 1; ox++) {
                for (oy = -1; oy <= 1; oy++) {

                    /* Acquire location */
                    ag = &borg_grids[oy + y][ox + x];

                    /* skip non perma grids wall */
                    if (ag->feat != FEAT_PERM)
                        continue;

                    /* at least one perm wall next to this, dig it out */
                    return true;
                }
            }
        }

        /* not adjacent to a GCV,  Restore Grid */
        ag = &borg_grids[y][x];
    }

    /* Explore "rubble" */
    if (ag->feat == FEAT_RUBBLE && !borg.trait[BI_ISWEAK]) {
        return true;
    }

    /* Explore "closed doors" */
    if (ag->feat == FEAT_CLOSED) {
        /* some closed doors leave alone */
        if (breeder_level) {
            /* Did I close this one */
            for (i = 0; i < track_door.num; i++) {
                /* mark as icky if I closed this one */
                if ((track_door.x[i] == x) && (track_door.y[i] == y)) {
                    /* not interesting */
                    return false;
                }
            }
        }
        /* this door should be ok to open */
        return true;
    }

    /* Explore "visible traps" */
    if (feat_is_trap_holding(ag->feat)) {
        /* Do not disarm when blind */
        if (borg.trait[BI_ISBLIND])
            return false;

        /* Do not disarm when confused */
        if (borg.trait[BI_ISCONFUSED])
            return false;

        /* Do not disarm when hallucinating */
        if (borg.trait[BI_ISIMAGE])
            return false;

        /* Do not flow without lite */
        if (borg.trait[BI_LIGHT] == 0)
            return false;

        /* Do not disarm trap doors on level 99 */
        if (borg.trait[BI_CDEPTH] == 99 && ag->trap && !ag->glyph)
            return false;

        /* Do not disarm when you could end up dead */
        if (borg.trait[BI_CURHP] < 60)
            return false;

        /* Do not disarm when clumsy */
        if (borg.trait[BI_DISP] < 30 && borg.trait[BI_CLEVEL] < 20)
            return false;
        if (borg.trait[BI_DISP] < 45 && borg.trait[BI_CLEVEL] < 10)
            return false;
        if (borg.trait[BI_DISM] < 30 && borg.trait[BI_CLEVEL] < 20)
            return false;
        if (borg.trait[BI_DISM] < 45 && borg.trait[BI_CLEVEL] < 10)
            return false;

        /* Do not explore if a Scaryguy on the Level */
        if (scaryguy_on_level)
            return false;

        /* NOTE: the flow code allows a borg to flow through a trap and so he
         * may still try to disarm one on his way to the other interesting grid.
         * If mods are made to the above criteria for disarming traps, then mods
         * must also be made to borg_flow_spread() and borg_flow_direct()
         */

        /* Okay */
        return true;
    }

    /* Ignore other grids */
    return false;
}